

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOArrayLengthTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOArrayLengthCase::init
          (SSBOArrayLengthCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  size_t sVar4;
  ostream *poVar5;
  TestError *pTVar6;
  char *pcVar7;
  bool *__s;
  long lVar8;
  deUint32 invalidValue;
  GLint result;
  value_type local_2f8;
  string sizeStr;
  string qualifierStr;
  long *local_298;
  long local_290;
  long local_288 [2];
  undefined1 local_278 [112];
  ios_base local_208 [264];
  GLenum prop;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  invalidValue = 0xffffffff;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset(&prop,0,0xac);
  pcVar7 = glcts::fixed_sample_locations_values + 1;
  if (this->m_access == ACCESS_WRITEONLY) {
    pcVar7 = "writeonly ";
  }
  __s = (bool *)0x1b29d3b;
  if (this->m_access != ACCESS_READONLY) {
    __s = (bool *)pcVar7;
  }
  qualifierStr._M_dataplus._M_p = (pointer)&qualifierStr.field_2;
  sVar4 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&qualifierStr,__s,__s + sVar4);
  if (this->m_sized == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
    std::ostream::operator<<(local_278,0x10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
    std::ios_base::~ios_base(local_208);
  }
  else {
    sizeStr._M_dataplus._M_p = (pointer)&sizeStr.field_2;
    sizeStr._M_string_length = 0;
    sizeStr.field_2._M_local_buf[0] = '\0';
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"layout(local_size_x = 1, local_size_y = 1) in;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"layout(std430) buffer;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"layout(binding = 0) buffer Out\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"    int outLength;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"    uint unused;\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"} sb_out;\n",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"layout(binding = 1) ",0x14);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_278,qualifierStr._M_dataplus._M_p,
                      qualifierStr._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"buffer Target\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    float array[",0x10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,sizeStr._M_dataplus._M_p,sizeStr._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"} sb_target;\n\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  if ((this->m_access & ~ACCESS_READONLY) == ACCESS_DEFAULT) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"    sb_out.unused = uint(sb_target.array[1]);\n",0x2e);
  }
  if (this->m_access < ACCESS_READONLY) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"    sb_target.array[2] = float(sb_out.unused);\n",0x2f);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"    sb_out.outLength = sb_target.array.length();\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sizeStr._M_dataplus._M_p != &sizeStr.field_2) {
    operator_delete(sizeStr._M_dataplus._M_p,
                    CONCAT71(sizeStr.field_2._M_allocated_capacity._1_7_,
                             sizeStr.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)qualifierStr._M_dataplus._M_p != &qualifierStr.field_2) {
    operator_delete(qualifierStr._M_dataplus._M_p,qualifierStr.field_2._M_allocated_capacity + 1);
  }
  result = 5;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f8,local_298,local_290 + (long)local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&prop + (ulong)(uint)result * 6),&local_2f8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)&prop);
  this->m_shader = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&prop + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_shader);
  if ((this->m_shader->m_program).m_info.linkOk == false) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    local_278._0_8_ = local_278 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Failed to build shader","")
    ;
    tcu::TestError::TestError(pTVar6,(string *)local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar3 + 0x6c8))(1,&this->m_outputBufferID);
  (**(code **)(lVar3 + 0x40))(0x90d2,this->m_outputBufferID);
  (**(code **)(lVar3 + 0x150))(0x90d2,8,&invalidValue,0x88ea);
  (**(code **)(lVar3 + 0x6c8))(1,&this->m_targetBufferID);
  (**(code **)(lVar3 + 0x40))(0x90d2,this->m_targetBufferID);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"create buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0x6e);
  (**(code **)(lVar3 + 0x48))(0x90d2,0,this->m_outputBufferID);
  (**(code **)(lVar3 + 0x48))(0x90d2,1,this->m_targetBufferID);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"bind buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0x73);
  iVar1 = (**(code **)(lVar3 + 0x9a8))((this->m_shader->m_program).m_program,0x92e5,"Out.outLength")
  ;
  prop = 0x92fc;
  result = 0;
  if (iVar1 == -1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    local_278._0_8_ = local_278 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"Failed to find outLength variable","");
    tcu::TestError::TestError(pTVar6,(string *)local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar3 + 0x9c8))
            ((this->m_shader->m_program).m_program,0x92e5,iVar1,1,&prop,1,0,&result);
  if (result != 0) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    local_278._0_8_ = local_278 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"Unexpected outLength location","");
    tcu::TestError::TestError(pTVar6,(string *)local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar1 = (**(code **)(lVar3 + 0x9a8))((this->m_shader->m_program).m_program,0x92e5,"Out.unused");
  prop = 0x92fc;
  result = 0;
  if (iVar1 == -1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    local_278._0_8_ = local_278 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"Failed to find unused variable","");
    tcu::TestError::TestError(pTVar6,(string *)local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar3 + 0x9c8))
            ((this->m_shader->m_program).m_program,0x92e5,iVar1,1,&prop,1,0,&result);
  if (result != 4) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    local_278._0_8_ = local_278 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"Unexpected unused location","");
    tcu::TestError::TestError(pTVar6,(string *)local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar1 = (**(code **)(lVar3 + 0x9a8))((this->m_shader->m_program).m_program,0x92e5,"Target.array");
  prop = 0x92fe;
  result = 0;
  if (iVar1 == -1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    local_278._0_8_ = local_278 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"Failed to find array variable","");
    tcu::TestError::TestError(pTVar6,(string *)local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar1 = (**(code **)(lVar3 + 0x9c8))
                    ((this->m_shader->m_program).m_program,0x92e5,iVar1,1,&prop,1,0,&result);
  if (result == 4) {
    return iVar1;
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Unexpected array stride","");
  tcu::TestError::TestError(pTVar6,(string *)local_278);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SSBOArrayLengthCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const deUint32			invalidValue	= 0xFFFFFFFFUL;

	// program
	m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource()));
	m_testCtx.getLog() << *m_shader;

	if (!m_shader->isOk())
		throw tcu::TestError("Failed to build shader");

	// gen and attach buffers
	gl.genBuffers(1, &m_outputBufferID);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBufferID);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, 2 * (int)sizeof(deUint32), &invalidValue, GL_DYNAMIC_COPY);

	gl.genBuffers(1, &m_targetBufferID);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_targetBufferID);

	GLU_EXPECT_NO_ERROR(gl.getError(), "create buffers");

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_outputBufferID);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_targetBufferID);

	GLU_EXPECT_NO_ERROR(gl.getError(), "bind buffers");

	// check the ssbo has expected layout
	{
		const deUint32		index	= gl.getProgramResourceIndex(m_shader->getProgram(), GL_BUFFER_VARIABLE, "Out.outLength");
		const glw::GLenum	prop	= GL_OFFSET;
		glw::GLint			result	= 0;

		if (index == GL_INVALID_INDEX)
			throw tcu::TestError("Failed to find outLength variable");

		gl.getProgramResourceiv(m_shader->getProgram(), GL_BUFFER_VARIABLE, index, 1, &prop, 1, DE_NULL, &result);

		if (result != 0)
			throw tcu::TestError("Unexpected outLength location");
	}
	{
		const deUint32		index	= gl.getProgramResourceIndex(m_shader->getProgram(), GL_BUFFER_VARIABLE, "Out.unused");
		const glw::GLenum	prop	= GL_OFFSET;
		glw::GLint			result	= 0;

		if (index == GL_INVALID_INDEX)
			throw tcu::TestError("Failed to find unused variable");

		gl.getProgramResourceiv(m_shader->getProgram(), GL_BUFFER_VARIABLE, index, 1, &prop, 1, DE_NULL, &result);

		if (result != 4)
			throw tcu::TestError("Unexpected unused location");
	}
	{
		const deUint32		index	= gl.getProgramResourceIndex(m_shader->getProgram(), GL_BUFFER_VARIABLE, "Target.array");
		const glw::GLenum	prop	= GL_ARRAY_STRIDE;
		glw::GLint			result	= 0;

		if (index == GL_INVALID_INDEX)
			throw tcu::TestError("Failed to find array variable");

		gl.getProgramResourceiv(m_shader->getProgram(), GL_BUFFER_VARIABLE, index, 1, &prop, 1, DE_NULL, &result);

		if (result != 4)
			throw tcu::TestError("Unexpected array stride");
	}
}